

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_compute_public_key(uint8_t *private_key,uint8_t *public_key)

{
  int iVar1;
  undefined1 local_88 [8];
  EccPoint public;
  uECC_word_t private [4];
  uint8_t *public_key_local;
  uint8_t *private_key_local;
  
  vli_bytesToNative(public.y + 3,private_key);
  iVar1 = EccPoint_compute_public_key((EccPoint *)local_88,public.y + 3);
  if (iVar1 != 0) {
    vli_nativeToBytes(public_key,(uint64_t *)local_88);
    vli_nativeToBytes(public_key + 0x20,public.x + 3);
  }
  private_key_local._4_4_ = (uint)(iVar1 != 0);
  return private_key_local._4_4_;
}

Assistant:

int uECC_compute_public_key(const uint8_t private_key[uECC_BYTES],
                            uint8_t public_key[uECC_BYTES * 2]) {
    uECC_word_t private[uECC_WORDS];
    EccPoint public;

    vli_bytesToNative(private, private_key);

    if (!EccPoint_compute_public_key(&public, private)) {
        return 0;
    }

    vli_nativeToBytes(public_key, public.x);
    vli_nativeToBytes(public_key + uECC_BYTES, public.y);
    return 1;
}